

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O2

iterator __thiscall
Type1ToType2Converter::CollectHintIndexesFromHere
          (Type1ToType2Converter *this,iterator inFirstStemHint)

{
  SizeTSet *this_00;
  short sVar1;
  _List_node_base *p_Var2;
  _List_const_iterator<long> __tmp;
  mapped_type *pmVar3;
  StemToSizeTMap *this_01;
  StemToSizeTMap *this_02;
  key_type local_50;
  StemToSizeTMap *local_40;
  StemToSizeTMap *local_38;
  
  this_00 = &this->mCurrentHints;
  local_40 = &this->mHStems;
  this_02 = &this->mVStems;
  local_38 = this_02;
  do {
    this_01 = local_40;
    if (inFirstStemHint._M_node == (_List_node_base *)&this->mConversionProgram) {
      return (iterator)inFirstStemHint._M_node;
    }
    sVar1 = *(short *)&inFirstStemHint._M_node[1]._M_next;
    if (sVar1 == 0xc02) {
      p_Var2 = inFirstStemHint._M_node[2]._M_next;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      pmVar3 = std::
               map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
               ::operator[](local_40,&local_50);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)this_00,pmVar3);
      p_Var2 = p_Var2->_M_prev->_M_prev;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      pmVar3 = std::
               map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
               ::operator[](this_01,&local_50);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)this_00,pmVar3);
      p_Var2 = p_Var2->_M_prev->_M_prev;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      this_02 = local_38;
    }
    else if (sVar1 == 3) {
      local_50.mExtent = (long)inFirstStemHint._M_node[2]._M_next[1]._M_next;
      local_50.mOrigin = (long)(inFirstStemHint._M_node[2]._M_next)->_M_prev[1]._M_next;
      this_01 = this_02;
    }
    else if (sVar1 == 0xc01) {
      p_Var2 = inFirstStemHint._M_node[2]._M_next;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      pmVar3 = std::
               map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
               ::operator[](this_02,&local_50);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)this_00,pmVar3);
      p_Var2 = p_Var2->_M_prev->_M_prev;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      pmVar3 = std::
               map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
               ::operator[](this_02,&local_50);
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)this_00,pmVar3);
      p_Var2 = p_Var2->_M_prev->_M_prev;
      local_50.mExtent = (long)p_Var2[1]._M_next;
      local_50.mOrigin = (long)p_Var2->_M_prev[1]._M_next;
      this_01 = this_02;
    }
    else {
      if (sVar1 != 1) {
        return (iterator)inFirstStemHint._M_node;
      }
      local_50.mExtent = (long)inFirstStemHint._M_node[2]._M_next[1]._M_next;
      local_50.mOrigin = (long)(inFirstStemHint._M_node[2]._M_next)->_M_prev[1]._M_next;
    }
    pmVar3 = std::
             map<Stem,_unsigned_long,_StemLess,_std::allocator<std::pair<const_Stem,_unsigned_long>_>_>
             ::operator[](this_01,&local_50);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)this_00,pmVar3);
    inFirstStemHint._M_node = (inFirstStemHint._M_node)->_M_next;
  } while( true );
}

Assistant:

ConversionNodeList::iterator Type1ToType2Converter::CollectHintIndexesFromHere(ConversionNodeList::iterator inFirstStemHint)
{
	ConversionNodeList::iterator it = inFirstStemHint;
	for(; it != mConversionProgram.end();++it)
	{
		// hstem
		if(1 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			
		} // vstem
		else if(3 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
		}// vstem3
		else if(0x0c01 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mVStems[Stem(origin,extent)]);
		}// hstem3
		else if(0x0c02 == it->mMarkerType)
		{
			LongList::const_reverse_iterator itOperands = it->mOperands.rbegin();

			long extent = *itOperands;
			++itOperands;
			long origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
			++itOperands;
			extent = *itOperands;
			++itOperands;
			origin = *itOperands;
			mCurrentHints.insert(mHStems[Stem(origin,extent)]);
		}
		else // stop stem set
		{
			break;
		}
	}
	return it; // return first instruction out of this set
}